

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_java_generator.cc
# Opt level: O3

void __thiscall
t_java_generator::generate_java_struct_tuple_reader
          (t_java_generator *this,ostream *out,t_struct *tstruct)

{
  int *piVar1;
  e_req eVar2;
  t_field *ptVar3;
  pointer pcVar4;
  int iVar5;
  ostream *poVar6;
  undefined4 extraout_var;
  pointer pptVar7;
  pointer pptVar8;
  string local_138;
  string local_118;
  t_java_generator *local_f8;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  poVar6 = t_generator::indent((t_generator *)this,out);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"@Override",9);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  poVar6 = t_generator::indent((t_generator *)this,out);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,"public void read(org.apache.thrift.protocol.TProtocol prot, ",0x3c);
  iVar5 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])(tstruct);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar6,*(char **)CONCAT44(extraout_var,iVar5),
                      ((undefined8 *)CONCAT44(extraout_var,iVar5))[1]);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6," struct) throws org.apache.thrift.TException {",0x2e);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  poVar6 = t_generator::indent((t_generator *)this,out);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,
             "org.apache.thrift.protocol.TTupleProtocol iprot = (org.apache.thrift.protocol.TTupleProtocol) prot;"
             ,99);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  pptVar8 = (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  pptVar7 = (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (pptVar8 != pptVar7) {
    iVar5 = 0;
    local_f8 = this;
    do {
      ptVar3 = *pptVar8;
      eVar2 = ptVar3->req_;
      if (eVar2 - T_OPTIONAL < 2) {
        iVar5 = iVar5 + 1;
      }
      else if (eVar2 == T_REQUIRED) {
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"struct.","");
        generate_deserialize_field(this,out,ptVar3,&local_50,false);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p);
        }
        this = local_f8;
        poVar6 = t_generator::indent((t_generator *)local_f8,out);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"struct.set",10);
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        pcVar4 = ((*pptVar8)->name_)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_70,pcVar4,pcVar4 + ((*pptVar8)->name_)._M_string_length);
        get_cap_name(&local_118,this,&local_70);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar6,local_118._M_dataplus._M_p,local_118._M_string_length);
        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"isSet","");
        get_cap_name(&local_138,this,&local_90);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar6,local_138._M_dataplus._M_p,local_138._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"(true);",7);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_138._M_dataplus._M_p != &local_138.field_2) {
          operator_delete(local_138._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          operator_delete(local_90._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_118._M_dataplus._M_p != &local_118.field_2) {
          operator_delete(local_118._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p);
        }
        pptVar7 = (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
      }
      pptVar8 = pptVar8 + 1;
    } while (pptVar8 != pptVar7);
    if (0 < iVar5) {
      poVar6 = t_generator::indent((t_generator *)this,out);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar6,"java.util.BitSet incoming = iprot.readBitSet(",0x2d);
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,");",2);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      pptVar8 = (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      pptVar7 = (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      if (pptVar8 != pptVar7) {
        iVar5 = 0;
        do {
          if ((*pptVar8)->req_ - T_OPTIONAL < 2) {
            poVar6 = t_generator::indent((t_generator *)this,out);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,"if (incoming.get(",0x11);
            poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar5);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,")) {",4);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length)
            ;
            piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
            *piVar1 = *piVar1 + 1;
            ptVar3 = *pptVar8;
            local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"struct.","");
            generate_deserialize_field(this,out,ptVar3,&local_b0,false);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
              operator_delete(local_b0._M_dataplus._M_p);
            }
            poVar6 = t_generator::indent((t_generator *)this,out);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,"struct.set",10);
            local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
            pcVar4 = ((*pptVar8)->name_)._M_dataplus._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_d0,pcVar4,pcVar4 + ((*pptVar8)->name_)._M_string_length);
            get_cap_name(&local_118,this,&local_d0);
            poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar6,local_118._M_dataplus._M_p,local_118._M_string_length);
            local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"isSet","");
            get_cap_name(&local_138,this,&local_f0);
            poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar6,local_138._M_dataplus._M_p,local_138._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,"(true);",7);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length)
            ;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_138._M_dataplus._M_p != &local_138.field_2) {
              operator_delete(local_138._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
              operator_delete(local_f0._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_118._M_dataplus._M_p != &local_118.field_2) {
              operator_delete(local_118._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
              operator_delete(local_d0._M_dataplus._M_p);
            }
            piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
            *piVar1 = *piVar1 + -1;
            poVar6 = t_generator::indent((t_generator *)this,out);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,"}",1);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length)
            ;
            iVar5 = iVar5 + 1;
            pptVar7 = (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
          }
          pptVar8 = pptVar8 + 1;
        } while (pptVar8 != pptVar7);
      }
    }
  }
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  poVar6 = t_generator::indent((t_generator *)this,out);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"}",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  return;
}

Assistant:

void t_java_generator::generate_java_struct_tuple_reader(ostream& out, t_struct* tstruct) {
  indent(out) << "@Override" << endl;
  indent(out) << "public void read(org.apache.thrift.protocol.TProtocol prot, "
              << tstruct->get_name() << " struct) throws org.apache.thrift.TException {" << endl;
  indent_up();
  indent(out) << "org.apache.thrift.protocol.TTupleProtocol iprot = (org.apache.thrift.protocol.TTupleProtocol) prot;" << endl;
  int optional_count = 0;
  const vector<t_field*>& fields = tstruct->get_members();
  vector<t_field*>::const_iterator f_iter;
  for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
    if ((*f_iter)->get_req() == t_field::T_OPTIONAL
        || (*f_iter)->get_req() == t_field::T_OPT_IN_REQ_OUT) {
      optional_count++;
    }
    if ((*f_iter)->get_req() == t_field::T_REQUIRED) {
      generate_deserialize_field(out, (*f_iter), "struct.", false);
      indent(out) << "struct.set" << get_cap_name((*f_iter)->get_name()) << get_cap_name("isSet")
                  << "(true);" << endl;
    }
  }
  if (optional_count > 0) {
    indent(out) << "java.util.BitSet incoming = iprot.readBitSet(" << optional_count << ");" << endl;
    int i = 0;
    for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
      if ((*f_iter)->get_req() == t_field::T_OPTIONAL
          || (*f_iter)->get_req() == t_field::T_OPT_IN_REQ_OUT) {
        indent(out) << "if (incoming.get(" << i << ")) {" << endl;
        indent_up();
        generate_deserialize_field(out, (*f_iter), "struct.", false);
        indent(out) << "struct.set" << get_cap_name((*f_iter)->get_name()) << get_cap_name("isSet")
                    << "(true);" << endl;
        indent_down();
        indent(out) << "}" << endl;
        i++;
      }
    }
  }
  indent_down();
  indent(out) << "}" << endl;
}